

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.hh
# Opt level: O0

void __thiscall Pl_SHA2::~Pl_SHA2(Pl_SHA2 *this)

{
  Pl_SHA2 *this_local;
  
  ~Pl_SHA2(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~Pl_SHA2() final = default;